

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O3

char * __thiscall
despot::util::tinyxml::TiXmlElement::Parse
          (TiXmlElement *this,char *p,TiXmlParsingData *data,TiXmlEncoding encoding)

{
  TiXmlString *name;
  Rep *pRVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  TiXmlDocument *this_00;
  char *p_00;
  TiXmlAttribute *this_01;
  TiXmlAttribute *pTVar5;
  size_t len;
  TiXmlEncoding encoding_00;
  TiXmlEncoding encoding_01;
  int iVar6;
  TiXmlString endTag;
  TiXmlString local_48;
  TiXmlAttributeSet *local_40;
  _func_int **local_38;
  
  pcVar4 = TiXmlBase::SkipWhiteSpace(p,encoding);
  this_00 = TiXmlNode::GetDocument(&this->super_TiXmlNode);
  if ((pcVar4 == (char *)0x0) || (cVar2 = *pcVar4, cVar2 == '\0')) {
    if (this_00 != (TiXmlDocument *)0x0) {
      TiXmlDocument::SetError(this_00,4,(char *)0x0,(TiXmlParsingData *)0x0,encoding);
      return (char *)0x0;
    }
  }
  else {
    if (data != (TiXmlParsingData *)0x0) {
      TiXmlParsingData::Stamp(data,pcVar4,encoding);
      (this->super_TiXmlNode).super_TiXmlBase.location = data->cursor;
      cVar2 = *pcVar4;
    }
    if (cVar2 == '<') {
      pcVar4 = TiXmlBase::SkipWhiteSpace(pcVar4 + 1,encoding);
      name = &(this->super_TiXmlNode).value;
      p_00 = TiXmlBase::ReadName(pcVar4,name,encoding_01);
      if ((p_00 != (char *)0x0) && (*p_00 != '\0')) {
        TiXmlString::TiXmlString(&local_48,"</");
        pRVar1 = name->rep_;
        TiXmlString::append(&local_48,pRVar1->str,pRVar1->size);
        TiXmlString::append(&local_48,">",1);
        local_40 = &this->attributeSet;
        local_38 = (_func_int **)&PTR__TiXmlAttribute_00190930;
        do {
          if (*p_00 == '\0') {
LAB_001728f0:
            if (local_48.rep_ != (Rep *)0x0 && local_48.rep_ != (Rep *)&TiXmlString::nullrep_) {
              operator_delete__(local_48.rep_);
              return p_00;
            }
            return p_00;
          }
          pcVar4 = TiXmlBase::SkipWhiteSpace(p_00,encoding);
          if (pcVar4 == (char *)0x0) {
LAB_00172811:
            iVar6 = 7;
LAB_00172816:
            if (this_00 != (TiXmlDocument *)0x0) {
LAB_0017281f:
              TiXmlDocument::SetError(this_00,iVar6,p_00,data,encoding);
            }
LAB_001728ed:
            p_00 = (char *)0x0;
            goto LAB_001728f0;
          }
          cVar2 = *pcVar4;
          if (cVar2 == '>') {
            encoding_00 = encoding;
            p_00 = ReadValue(this,pcVar4 + 1,data,encoding);
            if ((p_00 == (char *)0x0) || (*p_00 == '\0')) {
              if (this_00 != (TiXmlDocument *)0x0) {
                TiXmlDocument::SetError(this_00,9,p_00,data,encoding);
              }
              goto LAB_001728ed;
            }
            bVar3 = TiXmlBase::StringEqual(p_00,(local_48.rep_)->str,false,encoding_00);
            if (!bVar3) {
              iVar6 = 9;
              goto LAB_00172816;
            }
            p_00 = p_00 + (local_48.rep_)->size;
            goto LAB_001728f0;
          }
          if (cVar2 == '/') {
            if (pcVar4[1] != '>') {
              if (this_00 == (TiXmlDocument *)0x0) goto LAB_001728ed;
              p_00 = pcVar4 + 1;
              iVar6 = 8;
              goto LAB_0017281f;
            }
            p_00 = pcVar4 + 2;
            goto LAB_001728f0;
          }
          if (cVar2 == '\0') goto LAB_00172811;
          this_01 = (TiXmlAttribute *)operator_new(0x40);
          (this_01->super_TiXmlBase).location.row = -1;
          (this_01->super_TiXmlBase).location.col = -1;
          (this_01->super_TiXmlBase).userData = (void *)0x0;
          (this_01->super_TiXmlBase)._vptr_TiXmlBase = local_38;
          (this_01->name).rep_ = (Rep *)&TiXmlString::nullrep_;
          (this_01->value).rep_ = (Rep *)&TiXmlString::nullrep_;
          this_01->prev = (TiXmlAttribute *)0x0;
          this_01->next = (TiXmlAttribute *)0x0;
          this_01->document = this_00;
          p_00 = TiXmlAttribute::Parse(this_01,pcVar4,data,encoding);
          if ((p_00 == (char *)0x0) || (*p_00 == '\0')) {
            if (this_00 != (TiXmlDocument *)0x0) {
              TiXmlDocument::SetError(this_00,4,pcVar4,data,encoding);
            }
LAB_001728e3:
            (*(this_01->super_TiXmlBase)._vptr_TiXmlBase[1])(this_01);
            goto LAB_001728ed;
          }
          pTVar5 = TiXmlAttributeSet::Find(local_40,((this_01->name).rep_)->str);
          if (pTVar5 != (TiXmlAttribute *)0x0) {
            pcVar4 = ((this_01->value).rep_)->str;
            len = strlen(pcVar4);
            TiXmlString::assign(&pTVar5->value,pcVar4,len);
            goto LAB_001728e3;
          }
          TiXmlAttributeSet::Add(local_40,this_01);
        } while( true );
      }
      if (this_00 == (TiXmlDocument *)0x0) {
        return (char *)0x0;
      }
      iVar6 = 5;
    }
    else {
      if (this_00 == (TiXmlDocument *)0x0) {
        return (char *)0x0;
      }
      iVar6 = 4;
    }
    TiXmlDocument::SetError(this_00,iVar6,pcVar4,data,encoding);
  }
  return (char *)0x0;
}

Assistant:

const char* TiXmlElement::Parse(const char* p, TiXmlParsingData* data,
	TiXmlEncoding encoding) {
	p = SkipWhiteSpace(p, encoding);
	TiXmlDocument* document = GetDocument();

	if (!p || !*p) {
		if (document)
			document->SetError(TIXML_ERROR_PARSING_ELEMENT, 0, 0, encoding);
		return 0;
	}

	if (data) {
		data->Stamp(p, encoding);
		location = data->Cursor();
	}

	if (*p != '<') {
		if (document)
			document->SetError(TIXML_ERROR_PARSING_ELEMENT, p, data, encoding);
		return 0;
	}

	p = SkipWhiteSpace(p + 1, encoding);

	// Read the name.
	const char* pErr = p;

	p = ReadName(p, &value, encoding);
	if (!p || !*p) {
		if (document)
			document->SetError(TIXML_ERROR_FAILED_TO_READ_ELEMENT_NAME, pErr,
				data, encoding);
		return 0;
	}
	TIXML_STRING endTag("</");
	endTag += value;
	endTag += ">";

	// Check for and read attributes. Also look for an empty
	// tag or an end tag.
	while (p && *p) {
		pErr = p;
		p = SkipWhiteSpace(p, encoding);
		if (!p || !*p) {
			if (document)
				document->SetError(TIXML_ERROR_READING_ATTRIBUTES, pErr, data,
					encoding);
			return 0;
		}
		if (*p == '/') {
			++p;
			// Empty tag.
			if (*p != '>') {
				if (document)
					document->SetError(TIXML_ERROR_PARSING_EMPTY, p, data,
						encoding);
				return 0;
			}
			return (p + 1);
		} else if (*p == '>') {
			// Done with attributes (if there were any.)
			// Read the value -- which can include other
			// elements -- read the end tag, and return.
			++p;
			p = ReadValue(p, data, encoding); // Note this is an Element method, and will set the error if one happens.
			if (!p || !*p) {
				// We were looking for the end tag, but found nothing.
				// Fix for [ 1663758 ] Failure to report error on bad XML
				if (document)
					document->SetError(TIXML_ERROR_READING_END_TAG, p, data,
						encoding);
				return 0;
			}

			// We should find the end tag now
			if (StringEqual(p, endTag.c_str(), false, encoding)) {
				p += endTag.length();
				return p;
			} else {
				if (document)
					document->SetError(TIXML_ERROR_READING_END_TAG, p, data,
						encoding);
				return 0;
			}
		} else {
			// Try to read an attribute:
			TiXmlAttribute* attrib = new TiXmlAttribute();
			if (!attrib) {
				if (document)
					document->SetError(TIXML_ERROR_OUT_OF_MEMORY, pErr, data,
						encoding);
				return 0;
			}

			attrib->SetDocument(document);
			pErr = p;
			p = attrib->Parse(p, data, encoding);

			if (!p || !*p) {
				if (document)
					document->SetError(TIXML_ERROR_PARSING_ELEMENT, pErr, data,
						encoding);
				delete attrib;
				return 0;
			}

			// Handle the strange case of double attributes:
#ifdef TIXML_USE_STL
			TiXmlAttribute* node = attributeSet.Find( attrib->NameTStr() );
#else
			TiXmlAttribute* node = attributeSet.Find(attrib->Name());
#endif
			if (node) {
				node->SetValue(attrib->Value());
				delete attrib;
				return 0;
			}

			attributeSet.Add(attrib);
		}
	}
	return p;
}